

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O3

int cvLsFree(CVodeMem cv_mem)

{
  void *pvVar1;
  
  if ((cv_mem != (CVodeMem)0x0) && (pvVar1 = cv_mem->cv_lmem, pvVar1 != (void *)0x0)) {
    if (*(long *)((long)pvVar1 + 0x60) != 0) {
      N_VDestroy();
      *(undefined8 *)((long)pvVar1 + 0x60) = 0;
    }
    if (*(long *)((long)pvVar1 + 0x68) != 0) {
      N_VDestroy();
      *(undefined8 *)((long)pvVar1 + 0x68) = 0;
    }
    if (*(long *)((long)pvVar1 + 0x58) != 0) {
      SUNMatDestroy();
      *(undefined8 *)((long)pvVar1 + 0x58) = 0;
    }
    *(undefined8 *)((long)pvVar1 + 0x50) = 0;
    *(undefined8 *)((long)pvVar1 + 0x70) = 0;
    *(undefined8 *)((long)pvVar1 + 0x78) = 0;
    if (*(code **)((long)pvVar1 + 0xe8) != (code *)0x0) {
      (**(code **)((long)pvVar1 + 0xe8))(cv_mem);
    }
    free(cv_mem->cv_lmem);
  }
  return 0;
}

Assistant:

int cvLsFree(CVodeMem cv_mem)
{
  CVLsMem cvls_mem;

  /* Return immediately if CVodeMem or CVLsMem  are NULL */
  if (cv_mem == NULL) { return (CVLS_SUCCESS); }
  if (cv_mem->cv_lmem == NULL) { return (CVLS_SUCCESS); }
  cvls_mem = (CVLsMem)cv_mem->cv_lmem;

  /* Free N_Vector memory */
  if (cvls_mem->ytemp)
  {
    N_VDestroy(cvls_mem->ytemp);
    cvls_mem->ytemp = NULL;
  }
  if (cvls_mem->x)
  {
    N_VDestroy(cvls_mem->x);
    cvls_mem->x = NULL;
  }

  /* Free savedJ memory */
  if (cvls_mem->savedJ)
  {
    SUNMatDestroy(cvls_mem->savedJ);
    cvls_mem->savedJ = NULL;
  }

  /* Nullify other N_Vector pointers */
  cvls_mem->ycur = NULL;
  cvls_mem->fcur = NULL;

  /* Nullify other SUNMatrix pointer */
  cvls_mem->A = NULL;

  /* Free preconditioner memory (if applicable) */
  if (cvls_mem->pfree) { cvls_mem->pfree(cv_mem); }

  /* free CVLs interface structure */
  free(cv_mem->cv_lmem);

  return (CVLS_SUCCESS);
}